

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void LowererMD::EmitNon32BitOvfCheck(Instr *instr,Instr *insertInstr,LabelInstr *bailOutLabel)

{
  uint8 uVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  undefined4 *puVar6;
  RegOpnd *dstOpnd;
  Instr *pIVar7;
  RegOpnd *dstOpnd_00;
  IntConstOpnd *pIVar8;
  ulong value;
  
  if (instr->m_opcode != IMUL) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c01,"(instr->m_opcode == Js::OpCode::IMUL)",
                       "IMUL should be used to check for non-32 bit overflow check on x86.");
    if (!bVar4) goto LAB_00666e95;
    *puVar6 = 0;
  }
  dstOpnd = IR::RegOpnd::New(TyInt32,instr->m_func);
  dstOpnd->m_reg = RegArg2;
  pIVar7 = IR::Instr::New(NOP,&dstOpnd->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar7);
  dstOpnd_00 = IR::RegOpnd::New(TyInt32,instr->m_func);
  if (instr->ignoreOverflowBitCount < 0x21) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c0f,"(instr->ignoreOverflowBitCount > 32)",
                       "instr->ignoreOverflowBitCount > 32");
    if (!bVar4) goto LAB_00666e95;
    *puVar6 = 0;
  }
  uVar1 = instr->ignoreOverflowBitCount;
  pIVar7 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,&dstOpnd->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar7);
  value = (ulong)(byte)(0x40 - uVar1);
  pIVar8 = IR::IntConstOpnd::New(value,TyInt8,instr->m_func,true);
  pIVar7 = IR::Instr::New(SHL,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar8->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar7);
  pIVar8 = IR::IntConstOpnd::New(value,TyInt8,instr->m_func,true);
  pIVar7 = IR::Instr::New(SAR,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar8->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar7);
  pIVar7 = IR::Instr::New(CMP,instr->m_func);
  if (pIVar7->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_00666e95;
    *puVar6 = 0;
  }
  pFVar2 = pIVar7->m_func;
  if ((dstOpnd_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_00666e95;
    *puVar6 = 0;
  }
  bVar5 = (dstOpnd_00->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    dstOpnd_00 = (RegOpnd *)IR::Opnd::Copy(&dstOpnd_00->super_Opnd,pFVar2);
    bVar5 = (dstOpnd_00->super_Opnd).field_0xb;
  }
  (dstOpnd_00->super_Opnd).field_0xb = bVar5 | 2;
  pIVar7->m_src1 = &dstOpnd_00->super_Opnd;
  if (pIVar7->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_00666e95;
    *puVar6 = 0;
  }
  pFVar2 = pIVar7->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_00666e95:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  bVar5 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    dstOpnd = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar2);
    bVar5 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar5 | 2;
  pIVar7->m_src2 = &dstOpnd->super_Opnd;
  IR::Instr::InsertBefore(insertInstr,pIVar7);
  Lowerer::InsertBranch(JNE,false,bailOutLabel,insertInstr);
  return;
}

Assistant:

void
LowererMD::EmitNon32BitOvfCheck(IR::Instr *instr, IR::Instr *insertInstr, IR::LabelInstr* bailOutLabel)
{
    AssertMsg(instr->m_opcode == Js::OpCode::IMUL, "IMUL should be used to check for non-32 bit overflow check on x86.");

    IR::RegOpnd *edxSym = IR::RegOpnd::New(TyInt32, instr->m_func);
#ifdef _M_IX86
    edxSym->SetReg(RegEDX);
#else
    edxSym->SetReg(RegRDX);
#endif

    // dummy def for edx to force RegAlloc to generate a lifetime. This is removed later by the Peeps phase.
    IR::Instr *newInstr = IR::Instr::New(Js::OpCode::NOP, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    IR::RegOpnd *temp = IR::RegOpnd::New(TyInt32, instr->m_func);
    Assert(instr->ignoreOverflowBitCount > 32);
    uint8 shamt = 64 - instr->ignoreOverflowBitCount;

    // MOV temp, edx
    newInstr = IR::Instr::New(Js::OpCode::MOV, temp, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SHL temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SHL, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SAR temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SAR, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // CMP temp, edx
    newInstr = IR::Instr::New(Js::OpCode::CMP, instr->m_func);
    newInstr->SetSrc1(temp);
    newInstr->SetSrc2(edxSym);
    insertInstr->InsertBefore(newInstr);

    // JNE
    Lowerer::InsertBranch(Js::OpCode::JNE, false, bailOutLabel, insertInstr);
}